

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::BasicFileStream> * __thiscall
Diligent::RefCntAutoPtr<Diligent::BasicFileStream>::operator=
          (RefCntAutoPtr<Diligent::BasicFileStream> *this,
          RefCntAutoPtr<Diligent::BasicFileStream> *AutoPtr)

{
  BasicFileStream *pObj;
  RefCntAutoPtr<Diligent::BasicFileStream> *AutoPtr_local;
  RefCntAutoPtr<Diligent::BasicFileStream> *this_local;
  
  if (this->m_pObject != AutoPtr->m_pObject) {
    pObj = Detach(AutoPtr);
    Attach(this,pObj);
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }